

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O2

void __thiscall
testing::StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource>::StrictMock
          (StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource> *this)

{
  FunctionMocker<void_(const_bssl::ParsedCertificate_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_*)>
  *this_00;
  
  Mock::FailUninterestingCalls((uintptr_t)this);
  this_00 = &(this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833;
  memset(this_00,0,0x90);
  (this->super_MockCertIssuerSource).super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)&PTR__MockCertIssuerSource_005ac828;
  internal::
  FunctionMocker<void_(const_bssl::ParsedCertificate_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_*)>
  ::FunctionMocker(this_00);
  internal::
  FunctionMocker<void_(const_bssl::ParsedCertificate_*,_std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_*)>
  ::FunctionMocker(&(this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835);
  (this->super_MockCertIssuerSource).super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)&PTR__StrictMock_005ac798;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }